

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O3

void arc4_stir(void)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ssize_t sVar4;
  byte bVar5;
  uint uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  anon_struct_152_3_0413aac1 rdat;
  timeval tStack_a8;
  __pid_t local_98;
  
  if (rs_initialized == '\0') {
    uVar7 = '\0';
    uVar8 = '\x01';
    uVar9 = '\x02';
    uVar10 = '\x03';
    uVar11 = '\x04';
    uVar12 = '\x05';
    uVar13 = '\x06';
    uVar14 = '\a';
    uVar15 = '\b';
    uVar16 = '\t';
    uVar17 = '\n';
    uVar18 = '\v';
    uVar19 = '\f';
    uVar20 = '\r';
    uVar21 = '\x0e';
    uVar22 = '\x0f';
    lVar3 = 0;
    do {
      rs.s[lVar3] = uVar7;
      rs.s[lVar3 + 1] = uVar8;
      rs.s[lVar3 + 2] = uVar9;
      rs.s[lVar3 + 3] = uVar10;
      rs.s[lVar3 + 4] = uVar11;
      rs.s[lVar3 + 5] = uVar12;
      rs.s[lVar3 + 6] = uVar13;
      rs.s[lVar3 + 7] = uVar14;
      rs.s[lVar3 + 8] = uVar15;
      rs.s[lVar3 + 9] = uVar16;
      rs.s[lVar3 + 10] = uVar17;
      rs.s[lVar3 + 0xb] = uVar18;
      rs.s[lVar3 + 0xc] = uVar19;
      rs.s[lVar3 + 0xd] = uVar20;
      rs.s[lVar3 + 0xe] = uVar21;
      rs.s[lVar3 + 0xf] = uVar22;
      lVar3 = lVar3 + 0x10;
      uVar7 = uVar7 + '\x10';
      uVar8 = uVar8 + '\x10';
      uVar9 = uVar9 + '\x10';
      uVar10 = uVar10 + '\x10';
      uVar11 = uVar11 + '\x10';
      uVar12 = uVar12 + '\x10';
      uVar13 = uVar13 + '\x10';
      uVar14 = uVar14 + '\x10';
      uVar15 = uVar15 + '\x10';
      uVar16 = uVar16 + '\x10';
      uVar17 = uVar17 + '\x10';
      uVar18 = uVar18 + '\x10';
      uVar19 = uVar19 + '\x10';
      uVar20 = uVar20 + '\x10';
      uVar21 = uVar21 + '\x10';
      uVar22 = uVar22 + '\x10';
    } while (lVar3 != 0x100);
    rs.i = '\0';
    rs.j = '\0';
    rs_initialized = '\x01';
  }
  iVar2 = open("/dev/urandom",0x80000,0);
  if (-1 < iVar2) {
    sVar4 = read(iVar2,&tStack_a8,0x80);
    close(iVar2);
    if (sVar4 == 0x80) goto LAB_0018a34d;
  }
  gettimeofday(&tStack_a8,(__timezone_ptr_t)0x0);
  local_98 = getpid();
LAB_0018a34d:
  uVar6 = 0;
  do {
    bVar5 = rs.i;
    uVar7 = rs.s[bVar5];
    rs.j = rs.j + uVar7 + *(char *)((long)&tStack_a8.tv_sec + (ulong)(uVar6 & 0x7f));
    rs.s[bVar5] = rs.s[rs.j];
    rs.s[rs.j] = uVar7;
    uVar6 = uVar6 + 1;
    rs.i = bVar5 + 1;
  } while (uVar6 != 0x100);
  iVar2 = 0xc00;
  bVar1 = bVar5 + 1;
  do {
    rs.i = bVar1;
    uVar7 = rs.s[rs.i];
    bVar5 = bVar5 + uVar7;
    rs.s[rs.i] = rs.s[bVar5];
    rs.s[bVar5] = uVar7;
    iVar2 = iVar2 + -1;
    bVar1 = rs.i + 1;
  } while (iVar2 != 0);
  rs.j = bVar5;
  arc4_count = 1600000;
  return;
}

Assistant:

static void
arc4_stir(void)
{
	int done, fd, i;
	struct {
		struct timeval	tv;
		pid_t		pid;
		uint8_t		rnd[KEYSIZE];
	} rdat;

	if (!rs_initialized) {
		arc4_init();
		rs_initialized = 1;
	}
	done = 0;
	fd = open(RANDOMDEV, O_RDONLY | O_CLOEXEC, 0);
	if (fd >= 0) {
		if (read(fd, &rdat, KEYSIZE) == KEYSIZE)
			done = 1;
		(void)close(fd);
	}
	if (!done) {
		(void)gettimeofday(&rdat.tv, NULL);
		rdat.pid = getpid();
		/* We'll just take whatever was on the stack too... */
	}

	arc4_addrandom((uint8_t *)&rdat, KEYSIZE);

	/*
	 * Discard early keystream, as per recommendations in:
	 * "(Not So) Random Shuffles of RC4" by Ilya Mironov.
	 * As per the Network Operations Division, cryptographic requirements
	 * published on wikileaks on March 2017.
	 */

	for (i = 0; i < 3072; i++)
		(void)arc4_getbyte();
	arc4_count = 1600000;
}